

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

void Curl_flush_cookies(Curl_easy *data,_Bool cleanup)

{
  CookieInfo *cookies;
  curl_slist *list;
  uint uVar1;
  CURLcode error;
  int iVar2;
  void *__base;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  Cookie *pCVar6;
  undefined7 in_register_00000031;
  byte *filename;
  char cVar7;
  undefined8 unaff_R15;
  ulong uVar8;
  size_t __nmemb;
  FILE *out;
  char *local_48;
  uint local_40;
  undefined4 local_3c;
  byte *local_38;
  
  if ((data->set).str[5] == (char *)0x0) {
    if ((cleanup) && (list = (data->state).cookielist, list != (curl_slist *)0x0)) {
      curl_slist_free_all(list);
      (data->state).cookielist = (curl_slist *)0x0;
    }
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    goto LAB_004afe01;
  }
  if ((data->state).cookielist != (curl_slist *)0x0) {
    Curl_cookie_loadfiles(data);
  }
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  cookies = data->cookies;
  filename = (byte *)(data->set).str[5];
  out = (FILE *)0x0;
  local_48 = (char *)0x0;
  if (cookies == (CookieInfo *)0x0) goto LAB_004afe01;
  remove_expired(cookies);
  uVar1 = *filename - 0x2d;
  if (uVar1 == 0) {
    uVar1 = (uint)filename[1];
  }
  if (uVar1 == 0) {
    out = _stdout;
    uVar8 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
LAB_004afc60:
    fputs("# Netscape HTTP Cookie File\n# https://curl.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
          ,(FILE *)out);
    if (cookies->numcookies != 0) {
      __base = (*Curl_ccalloc)(1,cookies->numcookies << 3);
      if (__base == (void *)0x0) {
LAB_004afda8:
        cVar7 = (char)uVar8;
        error = CURLE_OUT_OF_MEMORY;
        goto LAB_004afdac;
      }
      local_40 = (uint)uVar8;
      __nmemb = 0;
      for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
        pCVar6 = (Cookie *)(cookies->cookies + lVar3);
        while (pCVar6 = pCVar6->next, pCVar6 != (Cookie *)0x0) {
          if (pCVar6->domain != (char *)0x0) {
            *(Cookie **)((long)__base + __nmemb * 8) = pCVar6;
            __nmemb = __nmemb + 1;
          }
        }
      }
      local_3c = (undefined4)CONCAT71(in_register_00000031,cleanup);
      local_38 = filename;
      qsort(__base,__nmemb,8,cookie_sort_ct);
      for (uVar1 = 0; uVar1 < __nmemb; uVar1 = uVar1 + 1) {
        pcVar4 = get_netscape_format(*(Cookie **)((long)__base + (ulong)uVar1 * 8));
        if (pcVar4 == (char *)0x0) {
          (*Curl_cfree)(__base);
          cleanup = SUB41(local_3c,0);
          uVar8 = (ulong)local_40;
          goto LAB_004afda8;
        }
        curl_mfprintf(out,"%s\n",pcVar4);
        (*Curl_cfree)(pcVar4);
      }
      (*Curl_cfree)(__base);
      cleanup = SUB41(local_3c,0);
      uVar8 = (ulong)local_40;
      filename = local_38;
    }
    pcVar4 = local_48;
    if ((char)uVar8 == '\0') {
      fclose((FILE *)out);
      out = (FILE *)0x0;
      if (local_48 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        iVar2 = Curl_rename(local_48,(char *)filename);
        pcVar4 = local_48;
        if (iVar2 != 0) {
          unlink(local_48);
          error = CURLE_WRITE_ERROR;
          cVar7 = '\0';
          goto LAB_004afdac;
        }
      }
    }
    (*Curl_cfree)(pcVar4);
  }
  else {
    error = Curl_fopen(data,(char *)filename,&out,&local_48);
    if (error == CURLE_OK) {
      uVar8 = 0;
      goto LAB_004afc60;
    }
    cVar7 = '\0';
LAB_004afdac:
    if ((out != (FILE *)0x0) && (cVar7 == '\0')) {
      fclose((FILE *)out);
    }
    (*Curl_cfree)(local_48);
    pcVar4 = (data->set).str[5];
    pcVar5 = curl_easy_strerror(error);
    Curl_infof(data,"WARNING: failed to save cookies in %s: %s",pcVar4,pcVar5);
  }
LAB_004afe01:
  if (cleanup != false) {
    if ((data->share == (Curl_share *)0x0) || (data->cookies != data->share->cookies)) {
      Curl_cookie_cleanup(data->cookies);
      data->cookies = (CookieInfo *)0x0;
    }
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, bool cleanup)
{
  CURLcode res;

  if(data->set.str[STRING_COOKIEJAR]) {
    if(data->state.cookielist) {
      /* If there is a list of cookie files to read, do it first so that
         we have all the told files read before we write the new jar.
         Curl_cookie_loadfiles() LOCKS and UNLOCKS the share itself! */
      Curl_cookie_loadfiles(data);
    }

    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    res = cookie_output(data, data->cookies, data->set.str[STRING_COOKIEJAR]);
    if(res)
      infof(data, "WARNING: failed to save cookies in %s: %s",
            data->set.str[STRING_COOKIEJAR], curl_easy_strerror(res));
  }
  else {
    if(cleanup && data->state.cookielist) {
      /* since nothing is written, we can just free the list of cookie file
         names */
      curl_slist_free_all(data->state.cookielist); /* clean up list */
      data->state.cookielist = NULL;
    }
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = NULL;
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}